

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O1

TestRole __thiscall testing::internal::ExecDeathTest::AssumeRole(ExecDeathTest *this)

{
  uint uVar1;
  InternalRunDeathTestFlag *pIVar2;
  TestInfo *pTVar3;
  int iVar4;
  int iVar5;
  void *__addr;
  int *piVar6;
  size_t sVar7;
  char unaff_R12B;
  size_t __len;
  const_iterator __position;
  ExecDeathTestArgs args_1;
  int pipe_fd [2];
  String local_70;
  Arguments args;
  String internal_flag;
  String filter_flag;
  
  UnitTest::GetInstance();
  pIVar2 = ((UnitTest::GetInstance::instance.impl_)->internal_run_death_test_flag_).ptr_;
  if (pIVar2 != (InternalRunDeathTestFlag *)0x0) {
    (this->super_ForkingDeathTest).super_DeathTestImpl.write_fd_ = pIVar2->write_fd_;
    return EXECUTE_TEST;
  }
  pTVar3 = (UnitTest::GetInstance::instance.impl_)->current_test_info_;
  uVar1 = (pTVar3->result_).death_test_count_;
  iVar4 = pipe(pipe_fd);
  if (iVar4 == -1) {
    String::Format((char *)&args,"CHECK failed: File %s, line %d: %s",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/googletest/src/gtest-death-test.cc"
                   ,0x3ec,"pipe(pipe_fd) != -1");
    DeathTestAbort((String *)&args);
  }
  else {
    iVar4 = fcntl(pipe_fd[1],2,0);
    if (iVar4 != -1) {
      String::Format((char *)&filter_flag,"--%s%s=%s.%s","gtest_","filter",
                     (pTVar3->test_case_name_)._M_dataplus._M_p,(pTVar3->name_)._M_dataplus._M_p);
      String::Format((char *)&internal_flag,"--%s%s=%s|%d|%d|%d","gtest_","internal_run_death_test",
                     this->file_,(ulong)(uint)this->line_,(ulong)uVar1,(ulong)(uint)pipe_fd[1]);
      Arguments::Arguments(&args);
      Arguments::AddArguments<testing::internal::String>
                (&args,(vector<testing::internal::String,_std::allocator<testing::internal::String>_>
                        *)g_argvs);
      __position._M_current =
           args.args_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
           super__Vector_impl_data._M_finish + -1;
      args_1.argv = (char **)strdup(filter_flag.c_str_);
      std::vector<char_*,_std::allocator<char_*>_>::_M_insert_rval
                (&args.args_,__position,(value_type *)&args_1);
      args_1.argv = (char **)strdup(internal_flag.c_str_);
      std::vector<char_*,_std::allocator<char_*>_>::_M_insert_rval
                (&args.args_,
                 (const_iterator)
                 (args.args_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                  super__Vector_impl_data._M_finish + -1),(value_type *)&args_1);
      args_1.argv = (char **)operator_new__(1);
      *(undefined1 *)args_1.argv = 0;
      args_1.close_fd = 0;
      args_1._12_4_ = 0;
      String::operator=((String *)&DeathTest::last_death_test_message_,(String *)&args_1);
      if (args_1.argv != (char **)0x0) {
        operator_delete__(args_1.argv);
      }
      CaptureStream(2,"stderr",(CapturedStream **)&g_captured_stderr);
      fflush((FILE *)0x0);
      args_1.argv = args.args_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
      args_1.close_fd = pipe_fd[0];
      iVar4 = -1;
      unaff_R12B = FLAGS_gtest_death_test_use_fork;
      if (FLAGS_gtest_death_test_use_fork != '\0') goto LAB_00113a4a;
      if (ExecDeathTestFork(char_const**,int)::stack_grows_down == '\0') goto LAB_00113b82;
      goto LAB_001139d9;
    }
  }
  this = (ExecDeathTest *)&args;
  String::Format((char *)this,"CHECK failed: File %s, line %d: %s",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/googletest/src/gtest-death-test.cc"
                 ,0x3ef,"fcntl(pipe_fd[1], F_SETFD, 0) != -1");
  DeathTestAbort((String *)this);
  do {
    String::Format((char *)&local_70,"CHECK failed: File %s, line %d: %s",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/googletest/src/gtest-death-test.cc"
                   ,0x3d7,"child_pid != -1");
    DeathTestAbort(&local_70);
LAB_00113b82:
    AssumeRole();
LAB_001139d9:
    iVar4 = getpagesize();
    __len = (size_t)iVar4;
    __addr = mmap((void *)0x0,__len,3,0x22,-1,0);
    if (__addr == (void *)0xffffffffffffffff) {
      String::Format((char *)&local_70,"CHECK failed: File %s, line %d: %s",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/googletest/src/gtest-death-test.cc"
                     ,0x3c6,"stack != MAP_FAILED");
      DeathTestAbort(&local_70);
LAB_00113bbc:
      String::Format((char *)&local_70,"CHECK failed: File %s, line %d: %s",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/googletest/src/gtest-death-test.cc"
                     ,0x3cc,"munmap(stack, stack_size) != -1");
      DeathTestAbort(&local_70);
LAB_00113bec:
      iVar4 = ExecDeathTestChildMain(&args_1);
      if (local_70.c_str_ != (char *)0x0) {
        operator_delete__(local_70.c_str_);
      }
      Arguments::~Arguments(&args);
      if (internal_flag.c_str_ != (char *)0x0) {
        operator_delete__(internal_flag.c_str_);
      }
      if (filter_flag.c_str_ != (char *)0x0) {
        operator_delete__(filter_flag.c_str_);
      }
      _Unwind_Resume(iVar4);
    }
    sVar7 = 0;
    if (ExecDeathTestFork(char_const**,int)::stack_grows_down != '\0') {
      sVar7 = __len;
    }
    iVar4 = clone(ExecDeathTestChildMain,(void *)(sVar7 + (long)__addr),0x11,&args_1);
    iVar5 = munmap(__addr,__len);
    if (iVar5 == -1) goto LAB_00113bbc;
LAB_00113a4a:
    if ((unaff_R12B != '\0') && (iVar4 = fork(), iVar4 == 0)) goto LAB_00113bec;
  } while (iVar4 == -1);
  do {
    iVar5 = close(pipe_fd[1]);
    if (iVar5 != -1) goto LAB_00113aab;
    piVar6 = __errno_location();
  } while (*piVar6 == 4);
  String::Format((char *)&args_1,"CHECK failed: File %s, line %d: %s != -1",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/googletest/src/gtest-death-test.cc"
                 ,0x406,"close(pipe_fd[1])");
  DeathTestAbort((String *)&args_1);
LAB_00113aab:
  *(int *)&(this->super_ForkingDeathTest).super_DeathTestImpl.field_0x2c = iVar4;
  (this->super_ForkingDeathTest).super_DeathTestImpl.read_fd_ = pipe_fd[0];
  (this->super_ForkingDeathTest).super_DeathTestImpl.spawned_ = true;
  Arguments::~Arguments(&args);
  if (internal_flag.c_str_ != (char *)0x0) {
    operator_delete__(internal_flag.c_str_);
  }
  if (filter_flag.c_str_ != (char *)0x0) {
    operator_delete__(filter_flag.c_str_);
  }
  return OVERSEE_TEST;
}

Assistant:

DeathTest::TestRole ExecDeathTest::AssumeRole() {
  const UnitTestImpl* const impl = GetUnitTestImpl();
  const InternalRunDeathTestFlag* const flag =
      impl->internal_run_death_test_flag();
  const TestInfo* const info = impl->current_test_info();
  const int death_test_index = info->result()->death_test_count();

  if (flag != NULL) {
    set_write_fd(flag->write_fd());
    return EXECUTE_TEST;
  }

  int pipe_fd[2];
  GTEST_DEATH_TEST_CHECK_(pipe(pipe_fd) != -1);
  // Clear the close-on-exec flag on the write end of the pipe, lest
  // it be closed when the child process does an exec:
  GTEST_DEATH_TEST_CHECK_(fcntl(pipe_fd[1], F_SETFD, 0) != -1);

  const String filter_flag =
      String::Format("--%s%s=%s.%s",
                     GTEST_FLAG_PREFIX_, kFilterFlag,
                     info->test_case_name(), info->name());
  const String internal_flag =
      String::Format("--%s%s=%s|%d|%d|%d",
                     GTEST_FLAG_PREFIX_, kInternalRunDeathTestFlag,
                     file_, line_, death_test_index, pipe_fd[1]);
  Arguments args;
  args.AddArguments(GetArgvs());
  args.AddArgument(filter_flag.c_str());
  args.AddArgument(internal_flag.c_str());

  DeathTest::set_last_death_test_message("");

  CaptureStderr();
  // See the comment in NoExecDeathTest::AssumeRole for why the next line
  // is necessary.
  FlushInfoLog();

  const pid_t child_pid = ExecDeathTestFork(args.Argv(), pipe_fd[0]);
  GTEST_DEATH_TEST_CHECK_SYSCALL_(close(pipe_fd[1]));
  set_child_pid(child_pid);
  set_read_fd(pipe_fd[0]);
  set_spawned(true);
  return OVERSEE_TEST;
}